

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.hpp
# Opt level: O1

ostream * plot::detail::operator<<(ostream *stream,label_line *line)

{
  Align AVar1;
  char *first;
  ulong width;
  size_t sVar2;
  ostream *poVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  pair<const_char_*,_unsigned_long> pVar9;
  
  sVar5 = (line->label_->text_)._M_len;
  first = (line->label_->text_)._M_str;
  sVar2 = utf8_string_width<char_const*>(first,first + sVar5);
  width = line->label_->width_;
  if (width != sVar2 && width != 0) {
    uVar4 = width - sVar2;
    if (sVar2 <= width) {
      AVar1 = line->label_->align_;
      uVar6 = 0;
      if (AVar1 == Right) {
        uVar6 = uVar4;
      }
      uVar7 = uVar6;
      if (AVar1 == Center) {
        uVar6 = uVar4 >> 1;
        uVar7 = uVar4 >> 1;
      }
      for (; uVar6 != 0; uVar6 = uVar6 - 1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (stream,(line->label_->fill_)._M_str,(line->label_->fill_)._M_len);
      }
      std::__ostream_insert<char,std::char_traits<char>>(stream,first,sVar5);
      if (uVar4 != uVar7) {
        lVar8 = (uVar7 + sVar2) - width;
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    (stream,(line->label_->fill_)._M_str,(line->label_->fill_)._M_len);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0);
      }
      return stream;
    }
    pVar9 = utf8_clamp<char_const*>(first,first + sVar5,width);
    sVar5 = (long)pVar9.first - (long)first;
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(stream,first,sVar5);
  return poVar3;
}

Assistant:

inline std::ostream& operator<<(std::ostream& stream, label_line const& line) {
        auto const text = line.label_->text_;
        auto const twidth = utf8_string_width(text);
        auto const width = line.label_->width_;

        if (!width || twidth == width)
            return stream << text;

        if (twidth > width)
            return stream << utf8_clamp(text, width).first;

        std::size_t padding = width - twidth;
        std::size_t padding_left =
            (line.label_->align_ == Align::Center) ? padding / 2 :
                (line.label_->align_ == Align::Right) ? padding : 0;
        std::size_t padding_right = padding - padding_left;

        while (padding_left--)
            stream << line.label_->fill_;

        stream << text;

        while (padding_right--)
            stream << line.label_->fill_;

        return stream;
    }